

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O0

void PixelToaster::convert_XBGRFFFF_to_XBGR8888(Pixel *source,integer32 *destination,uint count)

{
  integer32 iVar1;
  integer32 iVar2;
  integer32 iVar3;
  integer32 b;
  integer32 g;
  integer32 r;
  uint i;
  uint count_local;
  integer32 *destination_local;
  Pixel *source_local;
  
  for (g = 0; g < count; g = g + 1) {
    iVar1 = clamped_fraction_8(source[g].r);
    iVar2 = clamped_fraction_8(source[g].g);
    iVar3 = clamped_fraction_8(source[g].b);
    destination[g] = iVar1 >> 0xf | iVar2 >> 7 | iVar3 << 1;
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_XBGR8888(const Pixel source[], integer32 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        const integer32 r = clamped_fraction_8(source[i].r) >> 15;
        const integer32 g = clamped_fraction_8(source[i].g) >> 7;
        const integer32 b = clamped_fraction_8(source[i].b) << 1;

        destination[i] = r | g | b;
    }
}